

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

int append_node_to_array(trie_node ***ary,uint *len,trie_node *n)

{
  long lVar1;
  int iVar2;
  trie_node **pptVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pptVar3 = (trie_node **)lrtr_realloc(*ary,(ulong)*len << 6);
  if (pptVar3 == (trie_node **)0x0) {
    iVar2 = -1;
  }
  else {
    *ary = pptVar3;
    pptVar3[*len - 1] = n;
    iVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int append_node_to_array(struct trie_node ***ary, unsigned int *len, struct trie_node *n)
{
	struct trie_node **new;

	new = lrtr_realloc(*ary, *len * sizeof(*n));
	if (!new)
		return -1;

	*ary = new;
	(*ary)[*len - 1] = n;
	return 0;
}